

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O3

void __thiscall
NaStateSpaceModel::SetMatrices
          (NaStateSpaceModel *this,NaMatrix *mA,NaMatrix *mB,NaMatrix *mC,NaMatrix *mD)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  iVar1 = (*mA->_vptr_NaMatrix[7])(mA);
  if (iVar1 != 0) {
    iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
    if (iVar1 != 0) {
      iVar1 = (*mB->_vptr_NaMatrix[7])(mB);
      if (iVar1 != 0) {
        iVar1 = (*mB->_vptr_NaMatrix[6])(mB);
        if (iVar1 != 0) {
          iVar1 = (*mC->_vptr_NaMatrix[7])(mC);
          if (iVar1 != 0) {
            iVar1 = (*mC->_vptr_NaMatrix[6])(mC);
            if (iVar1 != 0) {
              iVar1 = (*mD->_vptr_NaMatrix[7])(mD);
              if (iVar1 != 0) {
                iVar1 = (*mD->_vptr_NaMatrix[6])(mD);
                if (iVar1 != 0) {
                  iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
                  iVar2 = (*mA->_vptr_NaMatrix[7])(mA);
                  if (iVar1 == iVar2) {
                    iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
                    iVar2 = (*mB->_vptr_NaMatrix[6])(mB);
                    if (iVar1 == iVar2) {
                      iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
                      iVar2 = (*mC->_vptr_NaMatrix[7])(mC);
                      if (iVar1 == iVar2) {
                        iVar1 = (*mC->_vptr_NaMatrix[6])(mC);
                        iVar2 = (*mD->_vptr_NaMatrix[6])(mD);
                        if (iVar1 == iVar2) {
                          iVar1 = (*mB->_vptr_NaMatrix[7])(mB);
                          iVar2 = (*mD->_vptr_NaMatrix[7])(mD);
                          if (iVar1 == iVar2) {
                            NaMatrix::operator=(&this->A,mA);
                            NaMatrix::operator=(&this->B,mB);
                            NaMatrix::operator=(&this->C,mC);
                            NaMatrix::operator=(&this->D,mD);
                            uVar3 = NaMatrix::dim_rows(&this->A);
                            this->n = uVar3;
                            uVar3 = NaMatrix::dim_rows(&this->C);
                            this->m = uVar3;
                            uVar3 = NaMatrix::dim_cols(&this->B);
                            this->k = uVar3;
                            NaUnit::Assign(&this->super_NaUnit,uVar3,this->m,0);
                            return;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 2;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void
NaStateSpaceModel::SetMatrices (const NaMatrix& mA,
				const NaMatrix& mB,
				const NaMatrix& mC,
				const NaMatrix& mD)
{
    if(!(mA.dim_cols() > 0 && mA.dim_rows() > 0 &&
         mB.dim_cols() > 0 && mB.dim_rows() > 0 &&
         mC.dim_cols() > 0 && mC.dim_rows() > 0 &&
         mD.dim_cols() > 0 && mD.dim_rows() > 0 &&
         mA.dim_rows() == mA.dim_cols() &&
         mA.dim_rows() == mB.dim_rows() &&
         mA.dim_rows() == mC.dim_cols() &&
         mC.dim_rows() == mD.dim_rows() &&
         mB.dim_cols() == mD.dim_cols())){
	throw(na_size_mismatch);
    }

    A = mA;
    B = mB;
    C = mC;
    D = mD;

    n = A.dim_rows();
    m = C.dim_rows();
    k = B.dim_cols();

    Assign(k, m);
}